

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::PrintValue<pstore::small_vector<int,8ul>,void>
               (small_vector<int,_8UL> *container,ostream *os)

{
  size_t sVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  char local_3d [5];
  size_t local_38;
  
  local_3d[2] = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_3d + 2,1);
  sVar1 = container->elements_;
  if (sVar1 != 0) {
    piVar2 = container->buffer_;
    lVar3 = sVar1 * 4;
    lVar4 = 0;
    local_38 = sVar1;
    do {
      if (lVar4 != 0) {
        local_3d[0] = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,local_3d,1);
        if (lVar4 == 0x20) {
          std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
          goto LAB_0016c3be;
        }
      }
      local_3d[1] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_3d + 1,1);
      std::ostream::operator<<((ostream *)os,piVar2[lVar4]);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + -4;
    } while (lVar3 != 0);
    if (local_38 != 0) {
LAB_0016c3be:
      local_3d[3] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_3d + 3,1);
    }
  }
  local_3d[4] = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_3d + 4,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }